

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void addtest(void *elem)

{
  int iVar1;
  void *realret;
  long lVar2;
  
  realret = add234(tree,elem);
  lVar2 = 0;
  while ((lVar2 < arraylen && (iVar1 = (*cmp)(elem,array[lVar2]), 0 < iVar1))) {
    lVar2 = lVar2 + 1;
  }
  if (((int)lVar2 < arraylen) && (iVar1 = (*cmp)(elem,array[lVar2]), iVar1 == 0)) {
    if (realret == array[lVar2]) {
      return;
    }
    error("add: retval was %p expected %p",realret);
    return;
  }
  internal_addtest(elem,(int)lVar2,realret);
  return;
}

Assistant:

void addtest(void *elem)
{
    int i;
    void *realret;

    realret = add234(tree, elem);

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i < arraylen && !cmp(elem, array[i])) {
        void *retval = array[i];       /* expect that returned not elem */
        if (realret != retval) {
            error("add: retval was %p expected %p", realret, retval);
        }
    } else
        internal_addtest(elem, i, realret);
}